

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util_tests.cpp
# Opt level: O0

void __thiscall util_tests::util_ParseMoney::test_method(util_ParseMoney *this)

{
  bool bVar1;
  long *plVar2;
  long in_FS_OFFSET;
  optional<long> oVar3;
  char *in_stack_ffffffffffffd5a8;
  lazy_ostream *in_stack_ffffffffffffd5b0;
  char *in_stack_ffffffffffffd5b8;
  lazy_ostream *in_stack_ffffffffffffd5d0;
  size_t in_stack_ffffffffffffd5d8;
  size_t line_num;
  const_string *in_stack_ffffffffffffd5e0;
  const_string *file;
  allocator<char> *in_stack_ffffffffffffd5e8;
  unit_test_log_t *this_00;
  char *in_stack_ffffffffffffd5f0;
  undefined7 in_stack_ffffffffffffd5f8;
  undefined1 in_stack_ffffffffffffd5ff;
  string *in_stack_ffffffffffffd660;
  util_ParseMoney *this_local;
  const_string local_1d70 [2];
  lazy_ostream local_1d50 [2];
  assertion_result local_1d30;
  unit_test_log_t local_1d18 [2];
  const_string local_1d08;
  const_string local_1cf8 [2];
  lazy_ostream local_1cd8 [2];
  assertion_result local_1cb8 [2];
  const_string local_1c80 [2];
  lazy_ostream local_1c60 [2];
  assertion_result local_1c40 [2];
  const_string local_1c08 [2];
  lazy_ostream local_1be8 [2];
  allocator<char> local_1bc1;
  assertion_result local_1bc0 [2];
  const_string local_1b88 [2];
  lazy_ostream local_1b68 [2];
  allocator<char> local_1b41;
  assertion_result local_1b40 [2];
  const_string local_1b08 [2];
  lazy_ostream local_1ae8 [2];
  allocator<char> local_1ac1;
  assertion_result local_1ac0 [2];
  const_string local_1a88 [2];
  lazy_ostream local_1a68 [2];
  allocator<char> local_1a41;
  assertion_result local_1a40 [2];
  const_string local_1a08 [2];
  lazy_ostream local_19e8 [2];
  allocator<char> local_19c1;
  assertion_result local_19c0 [2];
  const_string local_1988 [2];
  lazy_ostream local_1968 [2];
  allocator<char> local_1941;
  assertion_result local_1940 [2];
  const_string local_1908 [2];
  lazy_ostream local_18e8 [2];
  allocator<char> local_18c1;
  assertion_result local_18c0 [2];
  const_string local_1888 [2];
  lazy_ostream local_1868 [2];
  allocator<char> local_1841;
  assertion_result local_1840 [2];
  const_string local_1808 [2];
  lazy_ostream local_17e8 [2];
  allocator<char> local_17c1;
  assertion_result local_17c0 [2];
  const_string local_1788 [2];
  lazy_ostream local_1768 [2];
  allocator<char> local_1741;
  assertion_result local_1740 [2];
  const_string local_1708 [2];
  lazy_ostream local_16e8 [2];
  allocator<char> local_16c1;
  assertion_result local_16c0 [2];
  const_string local_1688 [2];
  lazy_ostream local_1668 [2];
  allocator<char> local_1641;
  assertion_result local_1640 [2];
  const_string local_1608 [2];
  lazy_ostream local_15e8 [2];
  allocator<char> local_15c1;
  assertion_result local_15c0 [2];
  const_string local_1588 [2];
  lazy_ostream local_1568 [2];
  allocator<char> local_1541;
  assertion_result local_1540 [2];
  const_string local_1508 [2];
  lazy_ostream local_14e8 [2];
  allocator<char> local_14c1;
  assertion_result local_14c0 [2];
  const_string local_1488 [2];
  lazy_ostream local_1468 [2];
  allocator<char> local_1441;
  assertion_result local_1440 [2];
  undefined1 local_1408 [16];
  undefined1 local_13f8 [16];
  undefined1 local_13e8 [64];
  undefined1 local_13a8 [16];
  undefined1 local_1398 [16];
  undefined1 local_1388 [64];
  undefined1 local_1348 [16];
  undefined1 local_1338 [16];
  undefined1 local_1328 [64];
  undefined1 local_12e8 [16];
  undefined1 local_12d8 [16];
  undefined1 local_12c8 [64];
  undefined1 local_1288 [16];
  undefined1 local_1278 [16];
  undefined1 local_1268 [64];
  undefined1 local_1228 [16];
  undefined1 local_1218 [16];
  undefined1 local_1208 [64];
  undefined1 local_11c8 [16];
  undefined1 local_11b8 [16];
  undefined1 local_11a8 [64];
  undefined1 local_1168 [16];
  undefined1 local_1158 [16];
  undefined1 local_1148 [64];
  undefined1 local_1108 [16];
  undefined1 local_10f8 [16];
  undefined1 local_10e8 [64];
  undefined1 local_10a8 [16];
  undefined1 local_1098 [16];
  undefined1 local_1088 [64];
  undefined1 local_1048 [16];
  undefined1 local_1038 [16];
  undefined1 local_1028 [40];
  undefined8 local_1000;
  allocator<char> local_fe1;
  undefined1 local_fe0 [16];
  undefined1 local_fd0 [71];
  allocator<char> local_f89;
  undefined1 local_f88 [16];
  undefined1 local_f78 [71];
  allocator<char> local_f31;
  undefined1 local_f30 [16];
  undefined1 local_f20 [71];
  allocator<char> local_ed9;
  undefined1 local_ed8 [16];
  undefined1 local_ec8 [71];
  allocator<char> local_e81;
  undefined1 local_e80 [16];
  undefined1 local_e70 [64];
  undefined1 local_e30 [16];
  undefined1 local_e20 [16];
  undefined1 local_e10 [64];
  undefined1 local_dd0 [16];
  undefined1 local_dc0 [16];
  undefined1 local_db0 [64];
  undefined1 local_d70 [16];
  undefined1 local_d60 [16];
  undefined1 local_d50 [64];
  undefined1 local_d10 [16];
  undefined1 local_d00 [16];
  undefined1 local_cf0 [64];
  undefined1 local_cb0 [16];
  undefined1 local_ca0 [16];
  undefined1 local_c90 [64];
  undefined1 local_c50 [16];
  undefined1 local_c40 [16];
  undefined1 local_c30 [64];
  undefined1 local_bf0 [16];
  undefined1 local_be0 [16];
  undefined1 local_bd0 [64];
  undefined1 local_b90 [16];
  undefined1 local_b80 [16];
  undefined1 local_b70 [64];
  undefined1 local_b30 [16];
  undefined1 local_b20 [16];
  undefined1 local_b10 [64];
  undefined1 local_ad0 [8];
  undefined1 local_ac8 [16];
  undefined1 local_ab8 [64];
  undefined1 local_a78 [8];
  undefined1 local_a70 [16];
  undefined1 local_a60 [64];
  undefined1 local_a20 [8];
  undefined1 local_a18 [16];
  undefined1 local_a08 [64];
  undefined1 local_9c8 [8];
  undefined1 local_9c0 [16];
  undefined1 local_9b0 [64];
  undefined1 local_970 [8];
  undefined1 local_968 [16];
  undefined1 local_958 [64];
  _Storage<long,_true> local_918;
  undefined1 local_910;
  _Storage<long,_true> local_908;
  undefined1 local_900;
  _Storage<long,_true> local_8f8;
  undefined1 local_8f0;
  _Storage<long,_true> local_8e8;
  undefined1 local_8e0;
  _Storage<long,_true> local_8d8;
  undefined1 local_8d0;
  _Storage<long,_true> local_8c8;
  undefined1 local_8c0;
  _Storage<long,_true> local_8b8;
  undefined1 local_8b0;
  _Storage<long,_true> local_8a8;
  undefined1 local_8a0;
  _Storage<long,_true> local_898;
  undefined1 local_890;
  _Storage<long,_true> local_888;
  undefined1 local_880;
  _Storage<long,_true> local_878;
  undefined1 local_870;
  _Storage<long,_true> local_868;
  undefined1 local_860;
  _Storage<long,_true> local_858;
  undefined1 local_850;
  _Storage<long,_true> local_848;
  undefined1 local_840;
  _Storage<long,_true> local_838;
  undefined1 local_830;
  _Storage<long,_true> local_828;
  undefined1 local_820;
  _Storage<long,_true> local_818;
  undefined1 local_810;
  _Storage<long,_true> local_808;
  undefined1 local_800;
  _Storage<long,_true> local_7f8;
  undefined1 local_7f0;
  _Storage<long,_true> local_7e8;
  undefined1 local_7e0;
  _Storage<long,_true> local_7d8;
  undefined1 local_7d0;
  _Storage<long,_true> local_7c8;
  undefined1 local_7c0;
  _Storage<long,_true> local_7b8;
  undefined1 local_7b0;
  _Storage<long,_true> local_7a8;
  undefined1 local_7a0;
  _Storage<long,_true> local_798;
  undefined1 local_790;
  _Storage<long,_true> local_788;
  undefined1 local_780;
  _Storage<long,_true> local_778;
  undefined1 local_770;
  _Storage<long,_true> local_768;
  undefined1 local_760;
  _Storage<long,_true> local_758;
  undefined1 local_750;
  _Storage<long,_true> local_748;
  undefined1 local_740;
  _Storage<long,_true> local_738;
  undefined1 local_730;
  _Storage<long,_true> local_728;
  undefined1 local_720;
  _Storage<long,_true> local_718;
  undefined1 local_710;
  _Storage<long,_true> local_708;
  undefined1 local_700;
  _Storage<long,_true> local_6f8;
  undefined1 local_6f0;
  _Storage<long,_true> local_6e8;
  undefined1 local_6e0;
  _Storage<long,_true> local_6d8;
  undefined1 local_6d0;
  _Storage<long,_true> local_6c8;
  undefined1 local_6c0;
  _Storage<long,_true> local_6b8;
  undefined1 local_6b0;
  _Storage<long,_true> local_6a8;
  undefined1 local_6a0;
  _Storage<long,_true> local_698;
  undefined1 local_690;
  _Storage<long,_true> local_688;
  undefined1 local_680;
  _Storage<long,_true> local_678;
  undefined1 local_670;
  _Storage<long,_true> local_668;
  undefined1 local_660;
  _Storage<long,_true> local_658;
  undefined1 local_650;
  _Storage<long,_true> local_648;
  undefined1 local_640;
  _Storage<long,_true> local_638;
  undefined1 local_630;
  _Storage<long,_true> local_628;
  undefined1 local_620;
  _Storage<long,_true> local_618;
  undefined1 local_610;
  long local_8;
  
  local_1000 = 0;
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd5b8,
               (pointer)in_stack_ffffffffffffd5b0,(unsigned_long)in_stack_ffffffffffffd5a8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd5a8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffd5e8,in_stack_ffffffffffffd5e0,
               in_stack_ffffffffffffd5d8,(const_string *)in_stack_ffffffffffffd5d0);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_ffffffffffffd5b0,(char (*) [1])in_stack_ffffffffffffd5a8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd5b8,
               (pointer)in_stack_ffffffffffffd5b0,(unsigned_long)in_stack_ffffffffffffd5a8);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_stack_ffffffffffffd5ff,in_stack_ffffffffffffd5f8),
               in_stack_ffffffffffffd5f0,in_stack_ffffffffffffd5e8);
    oVar3 = ParseMoney(in_stack_ffffffffffffd660);
    local_618._M_value =
         oVar3.super__Optional_base<long,_true,_true>._M_payload.super__Optional_payload_base<long>.
         _M_payload;
    local_610 = oVar3.super__Optional_base<long,_true,_true>._M_payload.
                super__Optional_payload_base<long>._M_engaged;
    plVar2 = std::optional<long>::value((optional<long> *)in_stack_ffffffffffffd5b8);
    local_970._0_4_ = 0;
    in_stack_ffffffffffffd5b8 = "0";
    in_stack_ffffffffffffd5b0 = (lazy_ostream *)local_970;
    in_stack_ffffffffffffd5a8 = "ParseMoney(\"0.0\").value()";
    boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,int>
              (local_958,local_968,0x17b,1,2,plVar2);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffd5a8);
    std::allocator<char>::~allocator((allocator<char> *)(local_970 + 7));
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffd5a8);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd5b8,
               (pointer)in_stack_ffffffffffffd5b0,(unsigned_long)in_stack_ffffffffffffd5a8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd5a8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffd5e8,in_stack_ffffffffffffd5e0,
               in_stack_ffffffffffffd5d8,(const_string *)in_stack_ffffffffffffd5d0);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_ffffffffffffd5b0,(char (*) [1])in_stack_ffffffffffffd5a8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd5b8,
               (pointer)in_stack_ffffffffffffd5b0,(unsigned_long)in_stack_ffffffffffffd5a8);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_stack_ffffffffffffd5ff,in_stack_ffffffffffffd5f8),
               in_stack_ffffffffffffd5f0,in_stack_ffffffffffffd5e8);
    oVar3 = ParseMoney(in_stack_ffffffffffffd660);
    local_628._M_value =
         oVar3.super__Optional_base<long,_true,_true>._M_payload.super__Optional_payload_base<long>.
         _M_payload;
    local_620 = oVar3.super__Optional_base<long,_true,_true>._M_payload.
                super__Optional_payload_base<long>._M_engaged;
    plVar2 = std::optional<long>::value((optional<long> *)in_stack_ffffffffffffd5b8);
    local_9c8._0_4_ = 0;
    in_stack_ffffffffffffd5b8 = "0";
    in_stack_ffffffffffffd5b0 = (lazy_ostream *)local_9c8;
    in_stack_ffffffffffffd5a8 = "ParseMoney(\".\").value()";
    boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,int>
              (local_9b0,local_9c0,0x17c,1,2,plVar2);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffd5a8);
    std::allocator<char>::~allocator((allocator<char> *)(local_9c8 + 7));
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffd5a8);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd5b8,
               (pointer)in_stack_ffffffffffffd5b0,(unsigned_long)in_stack_ffffffffffffd5a8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd5a8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffd5e8,in_stack_ffffffffffffd5e0,
               in_stack_ffffffffffffd5d8,(const_string *)in_stack_ffffffffffffd5d0);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_ffffffffffffd5b0,(char (*) [1])in_stack_ffffffffffffd5a8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd5b8,
               (pointer)in_stack_ffffffffffffd5b0,(unsigned_long)in_stack_ffffffffffffd5a8);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_stack_ffffffffffffd5ff,in_stack_ffffffffffffd5f8),
               in_stack_ffffffffffffd5f0,in_stack_ffffffffffffd5e8);
    oVar3 = ParseMoney(in_stack_ffffffffffffd660);
    local_638._M_value =
         oVar3.super__Optional_base<long,_true,_true>._M_payload.super__Optional_payload_base<long>.
         _M_payload;
    local_630 = oVar3.super__Optional_base<long,_true,_true>._M_payload.
                super__Optional_payload_base<long>._M_engaged;
    plVar2 = std::optional<long>::value((optional<long> *)in_stack_ffffffffffffd5b8);
    local_a20._0_4_ = 0;
    in_stack_ffffffffffffd5b8 = "0";
    in_stack_ffffffffffffd5b0 = (lazy_ostream *)local_a20;
    in_stack_ffffffffffffd5a8 = "ParseMoney(\"0.\").value()";
    boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,int>
              (local_a08,local_a18,0x17d,1,2,plVar2);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffd5a8);
    std::allocator<char>::~allocator((allocator<char> *)(local_a20 + 7));
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffd5a8);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd5b8,
               (pointer)in_stack_ffffffffffffd5b0,(unsigned_long)in_stack_ffffffffffffd5a8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd5a8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffd5e8,in_stack_ffffffffffffd5e0,
               in_stack_ffffffffffffd5d8,(const_string *)in_stack_ffffffffffffd5d0);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_ffffffffffffd5b0,(char (*) [1])in_stack_ffffffffffffd5a8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd5b8,
               (pointer)in_stack_ffffffffffffd5b0,(unsigned_long)in_stack_ffffffffffffd5a8);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_stack_ffffffffffffd5ff,in_stack_ffffffffffffd5f8),
               in_stack_ffffffffffffd5f0,in_stack_ffffffffffffd5e8);
    oVar3 = ParseMoney(in_stack_ffffffffffffd660);
    local_648._M_value =
         oVar3.super__Optional_base<long,_true,_true>._M_payload.super__Optional_payload_base<long>.
         _M_payload;
    local_640 = oVar3.super__Optional_base<long,_true,_true>._M_payload.
                super__Optional_payload_base<long>._M_engaged;
    plVar2 = std::optional<long>::value((optional<long> *)in_stack_ffffffffffffd5b8);
    local_a78._0_4_ = 0;
    in_stack_ffffffffffffd5b8 = "0";
    in_stack_ffffffffffffd5b0 = (lazy_ostream *)local_a78;
    in_stack_ffffffffffffd5a8 = "ParseMoney(\".0\").value()";
    boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,int>
              (local_a60,local_a70,0x17e,1,2,plVar2);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffd5a8);
    std::allocator<char>::~allocator((allocator<char> *)(local_a78 + 7));
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffd5a8);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd5b8,
               (pointer)in_stack_ffffffffffffd5b0,(unsigned_long)in_stack_ffffffffffffd5a8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd5a8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffd5e8,in_stack_ffffffffffffd5e0,
               in_stack_ffffffffffffd5d8,(const_string *)in_stack_ffffffffffffd5d0);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_ffffffffffffd5b0,(char (*) [1])in_stack_ffffffffffffd5a8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd5b8,
               (pointer)in_stack_ffffffffffffd5b0,(unsigned_long)in_stack_ffffffffffffd5a8);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_stack_ffffffffffffd5ff,in_stack_ffffffffffffd5f8),
               in_stack_ffffffffffffd5f0,in_stack_ffffffffffffd5e8);
    oVar3 = ParseMoney(in_stack_ffffffffffffd660);
    local_658._M_value =
         oVar3.super__Optional_base<long,_true,_true>._M_payload.super__Optional_payload_base<long>.
         _M_payload;
    local_650 = oVar3.super__Optional_base<long,_true,_true>._M_payload.
                super__Optional_payload_base<long>._M_engaged;
    plVar2 = std::optional<long>::value((optional<long> *)in_stack_ffffffffffffd5b8);
    local_ad0._0_4_ = 0x40beb50;
    in_stack_ffffffffffffd5b8 = "6789\'0000";
    in_stack_ffffffffffffd5b0 = (lazy_ostream *)local_ad0;
    in_stack_ffffffffffffd5a8 = "ParseMoney(\".6789\").value()";
    boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,int>
              (local_ab8,local_ac8,0x17f,1,2,plVar2);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffd5a8);
    std::allocator<char>::~allocator((allocator<char> *)(local_ad0 + 7));
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffd5a8);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd5b8,
               (pointer)in_stack_ffffffffffffd5b0,(unsigned_long)in_stack_ffffffffffffd5a8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd5a8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffd5e8,in_stack_ffffffffffffd5e0,
               in_stack_ffffffffffffd5d8,(const_string *)in_stack_ffffffffffffd5d0);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_ffffffffffffd5b0,(char (*) [1])in_stack_ffffffffffffd5a8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd5b8,
               (pointer)in_stack_ffffffffffffd5b0,(unsigned_long)in_stack_ffffffffffffd5a8);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_stack_ffffffffffffd5ff,in_stack_ffffffffffffd5f8),
               in_stack_ffffffffffffd5f0,in_stack_ffffffffffffd5e8);
    oVar3 = ParseMoney(in_stack_ffffffffffffd660);
    local_668._M_value =
         oVar3.super__Optional_base<long,_true,_true>._M_payload.super__Optional_payload_base<long>.
         _M_payload;
    local_660 = oVar3.super__Optional_base<long,_true,_true>._M_payload.
                super__Optional_payload_base<long>._M_engaged;
    plVar2 = std::optional<long>::value((optional<long> *)in_stack_ffffffffffffd5b8);
    local_b30._0_8_ = (_func_int **)0x11f6def1900;
    in_stack_ffffffffffffd5b8 = "COIN * 12345";
    in_stack_ffffffffffffd5b0 = (lazy_ostream *)local_b30;
    in_stack_ffffffffffffd5a8 = "ParseMoney(\"12345.\").value()";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,long>
              (local_b10,local_b20,0x180,1,2,plVar2);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffd5a8);
    std::allocator<char>::~allocator((allocator<char> *)(local_b30 + 0xf));
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffd5a8);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd5b8,
               (pointer)in_stack_ffffffffffffd5b0,(unsigned_long)in_stack_ffffffffffffd5a8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd5a8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffd5e8,in_stack_ffffffffffffd5e0,
               in_stack_ffffffffffffd5d8,(const_string *)in_stack_ffffffffffffd5d0);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_ffffffffffffd5b0,(char (*) [1])in_stack_ffffffffffffd5a8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd5b8,
               (pointer)in_stack_ffffffffffffd5b0,(unsigned_long)in_stack_ffffffffffffd5a8);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_stack_ffffffffffffd5ff,in_stack_ffffffffffffd5f8),
               in_stack_ffffffffffffd5f0,in_stack_ffffffffffffd5e8);
    oVar3 = ParseMoney(in_stack_ffffffffffffd660);
    local_678._M_value =
         oVar3.super__Optional_base<long,_true,_true>._M_payload.super__Optional_payload_base<long>.
         _M_payload;
    local_670 = oVar3.super__Optional_base<long,_true,_true>._M_payload.
                super__Optional_payload_base<long>._M_engaged;
    plVar2 = std::optional<long>::value((optional<long> *)in_stack_ffffffffffffd5b8);
    local_b90._0_8_ = (_func_int **)0x11f71fb0450;
    in_stack_ffffffffffffd5b8 = "(COIN/10000)*123456789";
    in_stack_ffffffffffffd5b0 = (lazy_ostream *)local_b90;
    in_stack_ffffffffffffd5a8 = "ParseMoney(\"12345.6789\").value()";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,long>
              (local_b70,local_b80,0x182,1,2,plVar2);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffd5a8);
    std::allocator<char>::~allocator((allocator<char> *)(local_b90 + 0xf));
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffd5a8);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd5b8,
               (pointer)in_stack_ffffffffffffd5b0,(unsigned_long)in_stack_ffffffffffffd5a8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd5a8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffd5e8,in_stack_ffffffffffffd5e0,
               in_stack_ffffffffffffd5d8,(const_string *)in_stack_ffffffffffffd5d0);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_ffffffffffffd5b0,(char (*) [1])in_stack_ffffffffffffd5a8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd5b8,
               (pointer)in_stack_ffffffffffffd5b0,(unsigned_long)in_stack_ffffffffffffd5a8);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_stack_ffffffffffffd5ff,in_stack_ffffffffffffd5f8),
               in_stack_ffffffffffffd5f0,in_stack_ffffffffffffd5e8);
    oVar3 = ParseMoney(in_stack_ffffffffffffd660);
    local_688._M_value =
         oVar3.super__Optional_base<long,_true,_true>._M_payload.super__Optional_payload_base<long>.
         _M_payload;
    local_680 = oVar3.super__Optional_base<long,_true,_true>._M_payload.
                super__Optional_payload_base<long>._M_engaged;
    plVar2 = std::optional<long>::value((optional<long> *)in_stack_ffffffffffffd5b8);
    local_bf0._0_8_ = (_func_int **)0x38d7ea4c68000;
    in_stack_ffffffffffffd5b8 = "COIN*10000000";
    in_stack_ffffffffffffd5b0 = (lazy_ostream *)local_bf0;
    in_stack_ffffffffffffd5a8 = "ParseMoney(\"10000000.00\").value()";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,long>
              (local_bd0,local_be0,0x184,1,2,plVar2);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffd5a8);
    std::allocator<char>::~allocator((allocator<char> *)(local_bf0 + 0xf));
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffd5a8);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd5b8,
               (pointer)in_stack_ffffffffffffd5b0,(unsigned_long)in_stack_ffffffffffffd5a8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd5a8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffd5e8,in_stack_ffffffffffffd5e0,
               in_stack_ffffffffffffd5d8,(const_string *)in_stack_ffffffffffffd5d0);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_ffffffffffffd5b0,(char (*) [1])in_stack_ffffffffffffd5a8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd5b8,
               (pointer)in_stack_ffffffffffffd5b0,(unsigned_long)in_stack_ffffffffffffd5a8);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_stack_ffffffffffffd5ff,in_stack_ffffffffffffd5f8),
               in_stack_ffffffffffffd5f0,in_stack_ffffffffffffd5e8);
    oVar3 = ParseMoney(in_stack_ffffffffffffd660);
    local_698._M_value =
         oVar3.super__Optional_base<long,_true,_true>._M_payload.super__Optional_payload_base<long>.
         _M_payload;
    local_690 = oVar3.super__Optional_base<long,_true,_true>._M_payload.
                super__Optional_payload_base<long>._M_engaged;
    plVar2 = std::optional<long>::value((optional<long> *)in_stack_ffffffffffffd5b8);
    local_c50._0_8_ = (_func_int **)0x5af3107a4000;
    in_stack_ffffffffffffd5b8 = "COIN*1000000";
    in_stack_ffffffffffffd5b0 = (lazy_ostream *)local_c50;
    in_stack_ffffffffffffd5a8 = "ParseMoney(\"1000000.00\").value()";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,long>
              (local_c30,local_c40,0x185,1,2,plVar2);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffd5a8);
    std::allocator<char>::~allocator((allocator<char> *)(local_c50 + 0xf));
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffd5a8);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd5b8,
               (pointer)in_stack_ffffffffffffd5b0,(unsigned_long)in_stack_ffffffffffffd5a8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd5a8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffd5e8,in_stack_ffffffffffffd5e0,
               in_stack_ffffffffffffd5d8,(const_string *)in_stack_ffffffffffffd5d0);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_ffffffffffffd5b0,(char (*) [1])in_stack_ffffffffffffd5a8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd5b8,
               (pointer)in_stack_ffffffffffffd5b0,(unsigned_long)in_stack_ffffffffffffd5a8);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_stack_ffffffffffffd5ff,in_stack_ffffffffffffd5f8),
               in_stack_ffffffffffffd5f0,in_stack_ffffffffffffd5e8);
    oVar3 = ParseMoney(in_stack_ffffffffffffd660);
    local_6a8._M_value =
         oVar3.super__Optional_base<long,_true,_true>._M_payload.super__Optional_payload_base<long>.
         _M_payload;
    local_6a0 = oVar3.super__Optional_base<long,_true,_true>._M_payload.
                super__Optional_payload_base<long>._M_engaged;
    plVar2 = std::optional<long>::value((optional<long> *)in_stack_ffffffffffffd5b8);
    local_cb0._0_8_ = (_func_int **)0x9184e72a000;
    in_stack_ffffffffffffd5b8 = "COIN*100000";
    in_stack_ffffffffffffd5b0 = (lazy_ostream *)local_cb0;
    in_stack_ffffffffffffd5a8 = "ParseMoney(\"100000.00\").value()";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,long>
              (local_c90,local_ca0,0x186,1,2,plVar2);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffd5a8);
    std::allocator<char>::~allocator((allocator<char> *)(local_cb0 + 0xf));
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffd5a8);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd5b8,
               (pointer)in_stack_ffffffffffffd5b0,(unsigned_long)in_stack_ffffffffffffd5a8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd5a8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffd5e8,in_stack_ffffffffffffd5e0,
               in_stack_ffffffffffffd5d8,(const_string *)in_stack_ffffffffffffd5d0);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_ffffffffffffd5b0,(char (*) [1])in_stack_ffffffffffffd5a8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd5b8,
               (pointer)in_stack_ffffffffffffd5b0,(unsigned_long)in_stack_ffffffffffffd5a8);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_stack_ffffffffffffd5ff,in_stack_ffffffffffffd5f8),
               in_stack_ffffffffffffd5f0,in_stack_ffffffffffffd5e8);
    oVar3 = ParseMoney(in_stack_ffffffffffffd660);
    local_6b8._M_value =
         oVar3.super__Optional_base<long,_true,_true>._M_payload.super__Optional_payload_base<long>.
         _M_payload;
    local_6b0 = oVar3.super__Optional_base<long,_true,_true>._M_payload.
                super__Optional_payload_base<long>._M_engaged;
    plVar2 = std::optional<long>::value((optional<long> *)in_stack_ffffffffffffd5b8);
    local_d10._0_8_ = (_func_int **)0xe8d4a51000;
    in_stack_ffffffffffffd5b8 = "COIN*10000";
    in_stack_ffffffffffffd5b0 = (lazy_ostream *)local_d10;
    in_stack_ffffffffffffd5a8 = "ParseMoney(\"10000.00\").value()";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,long>
              (local_cf0,local_d00,0x187,1,2,plVar2);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffd5a8);
    std::allocator<char>::~allocator((allocator<char> *)(local_d10 + 0xf));
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffd5a8);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd5b8,
               (pointer)in_stack_ffffffffffffd5b0,(unsigned_long)in_stack_ffffffffffffd5a8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd5a8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffd5e8,in_stack_ffffffffffffd5e0,
               in_stack_ffffffffffffd5d8,(const_string *)in_stack_ffffffffffffd5d0);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_ffffffffffffd5b0,(char (*) [1])in_stack_ffffffffffffd5a8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd5b8,
               (pointer)in_stack_ffffffffffffd5b0,(unsigned_long)in_stack_ffffffffffffd5a8);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_stack_ffffffffffffd5ff,in_stack_ffffffffffffd5f8),
               in_stack_ffffffffffffd5f0,in_stack_ffffffffffffd5e8);
    oVar3 = ParseMoney(in_stack_ffffffffffffd660);
    local_6c8._M_value =
         oVar3.super__Optional_base<long,_true,_true>._M_payload.super__Optional_payload_base<long>.
         _M_payload;
    local_6c0 = oVar3.super__Optional_base<long,_true,_true>._M_payload.
                super__Optional_payload_base<long>._M_engaged;
    plVar2 = std::optional<long>::value((optional<long> *)in_stack_ffffffffffffd5b8);
    local_d70._0_8_ = (_func_int **)0x174876e800;
    in_stack_ffffffffffffd5b8 = "COIN*1000";
    in_stack_ffffffffffffd5b0 = (lazy_ostream *)local_d70;
    in_stack_ffffffffffffd5a8 = "ParseMoney(\"1000.00\").value()";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,long>
              (local_d50,local_d60,0x188,1,2,plVar2);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffd5a8);
    std::allocator<char>::~allocator((allocator<char> *)(local_d70 + 0xf));
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffd5a8);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd5b8,
               (pointer)in_stack_ffffffffffffd5b0,(unsigned_long)in_stack_ffffffffffffd5a8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd5a8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffd5e8,in_stack_ffffffffffffd5e0,
               in_stack_ffffffffffffd5d8,(const_string *)in_stack_ffffffffffffd5d0);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_ffffffffffffd5b0,(char (*) [1])in_stack_ffffffffffffd5a8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd5b8,
               (pointer)in_stack_ffffffffffffd5b0,(unsigned_long)in_stack_ffffffffffffd5a8);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_stack_ffffffffffffd5ff,in_stack_ffffffffffffd5f8),
               in_stack_ffffffffffffd5f0,in_stack_ffffffffffffd5e8);
    oVar3 = ParseMoney(in_stack_ffffffffffffd660);
    local_6d8._M_value =
         oVar3.super__Optional_base<long,_true,_true>._M_payload.super__Optional_payload_base<long>.
         _M_payload;
    local_6d0 = oVar3.super__Optional_base<long,_true,_true>._M_payload.
                super__Optional_payload_base<long>._M_engaged;
    plVar2 = std::optional<long>::value((optional<long> *)in_stack_ffffffffffffd5b8);
    local_dd0._0_8_ = (_func_int **)0x2540be400;
    in_stack_ffffffffffffd5b8 = "COIN*100";
    in_stack_ffffffffffffd5b0 = (lazy_ostream *)local_dd0;
    in_stack_ffffffffffffd5a8 = "ParseMoney(\"100.00\").value()";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,long>
              (local_db0,local_dc0,0x189,1,2,plVar2);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffd5a8);
    std::allocator<char>::~allocator((allocator<char> *)(local_dd0 + 0xf));
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffd5a8);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd5b8,
               (pointer)in_stack_ffffffffffffd5b0,(unsigned_long)in_stack_ffffffffffffd5a8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd5a8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffd5e8,in_stack_ffffffffffffd5e0,
               in_stack_ffffffffffffd5d8,(const_string *)in_stack_ffffffffffffd5d0);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_ffffffffffffd5b0,(char (*) [1])in_stack_ffffffffffffd5a8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd5b8,
               (pointer)in_stack_ffffffffffffd5b0,(unsigned_long)in_stack_ffffffffffffd5a8);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_stack_ffffffffffffd5ff,in_stack_ffffffffffffd5f8),
               in_stack_ffffffffffffd5f0,in_stack_ffffffffffffd5e8);
    oVar3 = ParseMoney(in_stack_ffffffffffffd660);
    local_6e8._M_value =
         oVar3.super__Optional_base<long,_true,_true>._M_payload.super__Optional_payload_base<long>.
         _M_payload;
    local_6e0 = oVar3.super__Optional_base<long,_true,_true>._M_payload.
                super__Optional_payload_base<long>._M_engaged;
    plVar2 = std::optional<long>::value((optional<long> *)in_stack_ffffffffffffd5b8);
    local_e30._0_8_ = (_func_int **)0x3b9aca00;
    in_stack_ffffffffffffd5b8 = "COIN*10";
    in_stack_ffffffffffffd5b0 = (lazy_ostream *)local_e30;
    in_stack_ffffffffffffd5a8 = "ParseMoney(\"10.00\").value()";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,long>
              (local_e10,local_e20,0x18a,1,2,plVar2);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffd5a8);
    std::allocator<char>::~allocator((allocator<char> *)(local_e30 + 0xf));
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffd5a8);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd5b8,
               (pointer)in_stack_ffffffffffffd5b0,(unsigned_long)in_stack_ffffffffffffd5a8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd5a8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffd5e8,in_stack_ffffffffffffd5e0,
               in_stack_ffffffffffffd5d8,(const_string *)in_stack_ffffffffffffd5d0);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_ffffffffffffd5b0,(char (*) [1])in_stack_ffffffffffffd5a8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd5b8,
               (pointer)in_stack_ffffffffffffd5b0,(unsigned_long)in_stack_ffffffffffffd5a8);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_stack_ffffffffffffd5ff,in_stack_ffffffffffffd5f8),
               in_stack_ffffffffffffd5f0,in_stack_ffffffffffffd5e8);
    oVar3 = ParseMoney(in_stack_ffffffffffffd660);
    local_6f8._M_value =
         oVar3.super__Optional_base<long,_true,_true>._M_payload.super__Optional_payload_base<long>.
         _M_payload;
    local_6f0 = oVar3.super__Optional_base<long,_true,_true>._M_payload.
                super__Optional_payload_base<long>._M_engaged;
    plVar2 = std::optional<long>::value((optional<long> *)in_stack_ffffffffffffd5b8);
    in_stack_ffffffffffffd5b8 = "COIN";
    in_stack_ffffffffffffd5b0 = (lazy_ostream *)&COIN;
    in_stack_ffffffffffffd5a8 = "ParseMoney(\"1.00\").value()";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,long>
              (local_e70,local_e80,0x18b,1,2,plVar2);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffd5a8);
    std::allocator<char>::~allocator(&local_e81);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffd5a8);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd5b8,
               (pointer)in_stack_ffffffffffffd5b0,(unsigned_long)in_stack_ffffffffffffd5a8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd5a8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffd5e8,in_stack_ffffffffffffd5e0,
               in_stack_ffffffffffffd5d8,(const_string *)in_stack_ffffffffffffd5d0);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_ffffffffffffd5b0,(char (*) [1])in_stack_ffffffffffffd5a8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd5b8,
               (pointer)in_stack_ffffffffffffd5b0,(unsigned_long)in_stack_ffffffffffffd5a8);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_stack_ffffffffffffd5ff,in_stack_ffffffffffffd5f8),
               in_stack_ffffffffffffd5f0,in_stack_ffffffffffffd5e8);
    oVar3 = ParseMoney(in_stack_ffffffffffffd660);
    local_708._M_value =
         oVar3.super__Optional_base<long,_true,_true>._M_payload.super__Optional_payload_base<long>.
         _M_payload;
    local_700 = oVar3.super__Optional_base<long,_true,_true>._M_payload.
                super__Optional_payload_base<long>._M_engaged;
    plVar2 = std::optional<long>::value((optional<long> *)in_stack_ffffffffffffd5b8);
    in_stack_ffffffffffffd5b8 = "COIN";
    in_stack_ffffffffffffd5b0 = (lazy_ostream *)&COIN;
    in_stack_ffffffffffffd5a8 = "ParseMoney(\"1\").value()";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,long>
              (local_ec8,local_ed8,0x18c,1,2,plVar2);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffd5a8);
    std::allocator<char>::~allocator(&local_ed9);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffd5a8);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd5b8,
               (pointer)in_stack_ffffffffffffd5b0,(unsigned_long)in_stack_ffffffffffffd5a8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd5a8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffd5e8,in_stack_ffffffffffffd5e0,
               in_stack_ffffffffffffd5d8,(const_string *)in_stack_ffffffffffffd5d0);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_ffffffffffffd5b0,(char (*) [1])in_stack_ffffffffffffd5a8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd5b8,
               (pointer)in_stack_ffffffffffffd5b0,(unsigned_long)in_stack_ffffffffffffd5a8);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_stack_ffffffffffffd5ff,in_stack_ffffffffffffd5f8),
               in_stack_ffffffffffffd5f0,in_stack_ffffffffffffd5e8);
    oVar3 = ParseMoney(in_stack_ffffffffffffd660);
    local_718._M_value =
         oVar3.super__Optional_base<long,_true,_true>._M_payload.super__Optional_payload_base<long>.
         _M_payload;
    local_710 = oVar3.super__Optional_base<long,_true,_true>._M_payload.
                super__Optional_payload_base<long>._M_engaged;
    plVar2 = std::optional<long>::value((optional<long> *)in_stack_ffffffffffffd5b8);
    in_stack_ffffffffffffd5b8 = "COIN";
    in_stack_ffffffffffffd5b0 = (lazy_ostream *)&COIN;
    in_stack_ffffffffffffd5a8 = "ParseMoney(\"   1\").value()";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,long>
              (local_f20,local_f30,0x18d,1,2,plVar2);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffd5a8);
    std::allocator<char>::~allocator(&local_f31);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffd5a8);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd5b8,
               (pointer)in_stack_ffffffffffffd5b0,(unsigned_long)in_stack_ffffffffffffd5a8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd5a8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffd5e8,in_stack_ffffffffffffd5e0,
               in_stack_ffffffffffffd5d8,(const_string *)in_stack_ffffffffffffd5d0);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_ffffffffffffd5b0,(char (*) [1])in_stack_ffffffffffffd5a8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd5b8,
               (pointer)in_stack_ffffffffffffd5b0,(unsigned_long)in_stack_ffffffffffffd5a8);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_stack_ffffffffffffd5ff,in_stack_ffffffffffffd5f8),
               in_stack_ffffffffffffd5f0,in_stack_ffffffffffffd5e8);
    oVar3 = ParseMoney(in_stack_ffffffffffffd660);
    local_728._M_value =
         oVar3.super__Optional_base<long,_true,_true>._M_payload.super__Optional_payload_base<long>.
         _M_payload;
    local_720 = oVar3.super__Optional_base<long,_true,_true>._M_payload.
                super__Optional_payload_base<long>._M_engaged;
    plVar2 = std::optional<long>::value((optional<long> *)in_stack_ffffffffffffd5b8);
    in_stack_ffffffffffffd5b8 = "COIN";
    in_stack_ffffffffffffd5b0 = (lazy_ostream *)&COIN;
    in_stack_ffffffffffffd5a8 = "ParseMoney(\"1   \").value()";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,long>
              (local_f78,local_f88,0x18e,1,2,plVar2);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffd5a8);
    std::allocator<char>::~allocator(&local_f89);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffd5a8);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd5b8,
               (pointer)in_stack_ffffffffffffd5b0,(unsigned_long)in_stack_ffffffffffffd5a8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd5a8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffd5e8,in_stack_ffffffffffffd5e0,
               in_stack_ffffffffffffd5d8,(const_string *)in_stack_ffffffffffffd5d0);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_ffffffffffffd5b0,(char (*) [1])in_stack_ffffffffffffd5a8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd5b8,
               (pointer)in_stack_ffffffffffffd5b0,(unsigned_long)in_stack_ffffffffffffd5a8);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_stack_ffffffffffffd5ff,in_stack_ffffffffffffd5f8),
               in_stack_ffffffffffffd5f0,in_stack_ffffffffffffd5e8);
    oVar3 = ParseMoney(in_stack_ffffffffffffd660);
    local_738._M_value =
         oVar3.super__Optional_base<long,_true,_true>._M_payload.super__Optional_payload_base<long>.
         _M_payload;
    local_730 = oVar3.super__Optional_base<long,_true,_true>._M_payload.
                super__Optional_payload_base<long>._M_engaged;
    plVar2 = std::optional<long>::value((optional<long> *)in_stack_ffffffffffffd5b8);
    in_stack_ffffffffffffd5b8 = "COIN";
    in_stack_ffffffffffffd5b0 = (lazy_ostream *)&COIN;
    in_stack_ffffffffffffd5a8 = "ParseMoney(\"  1 \").value()";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,long>
              (local_fd0,local_fe0,399,1,2,plVar2);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffd5a8);
    std::allocator<char>::~allocator(&local_fe1);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffd5a8);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd5b8,
               (pointer)in_stack_ffffffffffffd5b0,(unsigned_long)in_stack_ffffffffffffd5a8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd5a8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffd5e8,in_stack_ffffffffffffd5e0,
               in_stack_ffffffffffffd5d8,(const_string *)in_stack_ffffffffffffd5d0);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_ffffffffffffd5b0,(char (*) [1])in_stack_ffffffffffffd5a8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd5b8,
               (pointer)in_stack_ffffffffffffd5b0,(unsigned_long)in_stack_ffffffffffffd5a8);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_stack_ffffffffffffd5ff,in_stack_ffffffffffffd5f8),
               in_stack_ffffffffffffd5f0,in_stack_ffffffffffffd5e8);
    oVar3 = ParseMoney(in_stack_ffffffffffffd660);
    local_748._M_value =
         oVar3.super__Optional_base<long,_true,_true>._M_payload.super__Optional_payload_base<long>.
         _M_payload;
    local_740 = oVar3.super__Optional_base<long,_true,_true>._M_payload.
                super__Optional_payload_base<long>._M_engaged;
    plVar2 = std::optional<long>::value((optional<long> *)in_stack_ffffffffffffd5b8);
    local_1048._0_8_ = (_func_int **)0x989680;
    in_stack_ffffffffffffd5b8 = "COIN/10";
    in_stack_ffffffffffffd5b0 = (lazy_ostream *)local_1048;
    in_stack_ffffffffffffd5a8 = "ParseMoney(\"0.1\").value()";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,long>
              (local_1028,local_1038,400,1,2,plVar2);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffd5a8);
    std::allocator<char>::~allocator((allocator<char> *)(local_1048 + 0xf));
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffd5a8);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd5b8,
               (pointer)in_stack_ffffffffffffd5b0,(unsigned_long)in_stack_ffffffffffffd5a8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd5a8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffd5e8,in_stack_ffffffffffffd5e0,
               in_stack_ffffffffffffd5d8,(const_string *)in_stack_ffffffffffffd5d0);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_ffffffffffffd5b0,(char (*) [1])in_stack_ffffffffffffd5a8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd5b8,
               (pointer)in_stack_ffffffffffffd5b0,(unsigned_long)in_stack_ffffffffffffd5a8);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_stack_ffffffffffffd5ff,in_stack_ffffffffffffd5f8),
               in_stack_ffffffffffffd5f0,in_stack_ffffffffffffd5e8);
    oVar3 = ParseMoney(in_stack_ffffffffffffd660);
    local_758._M_value =
         oVar3.super__Optional_base<long,_true,_true>._M_payload.super__Optional_payload_base<long>.
         _M_payload;
    local_750 = oVar3.super__Optional_base<long,_true,_true>._M_payload.
                super__Optional_payload_base<long>._M_engaged;
    plVar2 = std::optional<long>::value((optional<long> *)in_stack_ffffffffffffd5b8);
    local_10a8._0_8_ = (_func_int **)0xf4240;
    in_stack_ffffffffffffd5b8 = "COIN/100";
    in_stack_ffffffffffffd5b0 = (lazy_ostream *)local_10a8;
    in_stack_ffffffffffffd5a8 = "ParseMoney(\"0.01\").value()";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,long>
              (local_1088,local_1098,0x191,1,2,plVar2);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffd5a8);
    std::allocator<char>::~allocator((allocator<char> *)(local_10a8 + 0xf));
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffd5a8);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd5b8,
               (pointer)in_stack_ffffffffffffd5b0,(unsigned_long)in_stack_ffffffffffffd5a8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd5a8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffd5e8,in_stack_ffffffffffffd5e0,
               in_stack_ffffffffffffd5d8,(const_string *)in_stack_ffffffffffffd5d0);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_ffffffffffffd5b0,(char (*) [1])in_stack_ffffffffffffd5a8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd5b8,
               (pointer)in_stack_ffffffffffffd5b0,(unsigned_long)in_stack_ffffffffffffd5a8);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_stack_ffffffffffffd5ff,in_stack_ffffffffffffd5f8),
               in_stack_ffffffffffffd5f0,in_stack_ffffffffffffd5e8);
    oVar3 = ParseMoney(in_stack_ffffffffffffd660);
    local_768._M_value =
         oVar3.super__Optional_base<long,_true,_true>._M_payload.super__Optional_payload_base<long>.
         _M_payload;
    local_760 = oVar3.super__Optional_base<long,_true,_true>._M_payload.
                super__Optional_payload_base<long>._M_engaged;
    plVar2 = std::optional<long>::value((optional<long> *)in_stack_ffffffffffffd5b8);
    local_1108._0_8_ = (_func_int **)0x186a0;
    in_stack_ffffffffffffd5b8 = "COIN/1000";
    in_stack_ffffffffffffd5b0 = (lazy_ostream *)local_1108;
    in_stack_ffffffffffffd5a8 = "ParseMoney(\"0.001\").value()";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,long>
              (local_10e8,local_10f8,0x192,1,2,plVar2);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffd5a8);
    std::allocator<char>::~allocator((allocator<char> *)(local_1108 + 0xf));
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffd5a8);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd5b8,
               (pointer)in_stack_ffffffffffffd5b0,(unsigned_long)in_stack_ffffffffffffd5a8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd5a8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffd5e8,in_stack_ffffffffffffd5e0,
               in_stack_ffffffffffffd5d8,(const_string *)in_stack_ffffffffffffd5d0);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_ffffffffffffd5b0,(char (*) [1])in_stack_ffffffffffffd5a8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd5b8,
               (pointer)in_stack_ffffffffffffd5b0,(unsigned_long)in_stack_ffffffffffffd5a8);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_stack_ffffffffffffd5ff,in_stack_ffffffffffffd5f8),
               in_stack_ffffffffffffd5f0,in_stack_ffffffffffffd5e8);
    oVar3 = ParseMoney(in_stack_ffffffffffffd660);
    local_778._M_value =
         oVar3.super__Optional_base<long,_true,_true>._M_payload.super__Optional_payload_base<long>.
         _M_payload;
    local_770 = oVar3.super__Optional_base<long,_true,_true>._M_payload.
                super__Optional_payload_base<long>._M_engaged;
    plVar2 = std::optional<long>::value((optional<long> *)in_stack_ffffffffffffd5b8);
    local_1168._0_8_ = (_func_int **)0x2710;
    in_stack_ffffffffffffd5b8 = "COIN/10000";
    in_stack_ffffffffffffd5b0 = (lazy_ostream *)local_1168;
    in_stack_ffffffffffffd5a8 = "ParseMoney(\"0.0001\").value()";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,long>
              (local_1148,local_1158,0x193,1,2,plVar2);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffd5a8);
    std::allocator<char>::~allocator((allocator<char> *)(local_1168 + 0xf));
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffd5a8);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd5b8,
               (pointer)in_stack_ffffffffffffd5b0,(unsigned_long)in_stack_ffffffffffffd5a8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd5a8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffd5e8,in_stack_ffffffffffffd5e0,
               in_stack_ffffffffffffd5d8,(const_string *)in_stack_ffffffffffffd5d0);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_ffffffffffffd5b0,(char (*) [1])in_stack_ffffffffffffd5a8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd5b8,
               (pointer)in_stack_ffffffffffffd5b0,(unsigned_long)in_stack_ffffffffffffd5a8);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_stack_ffffffffffffd5ff,in_stack_ffffffffffffd5f8),
               in_stack_ffffffffffffd5f0,in_stack_ffffffffffffd5e8);
    oVar3 = ParseMoney(in_stack_ffffffffffffd660);
    local_788._M_value =
         oVar3.super__Optional_base<long,_true,_true>._M_payload.super__Optional_payload_base<long>.
         _M_payload;
    local_780 = oVar3.super__Optional_base<long,_true,_true>._M_payload.
                super__Optional_payload_base<long>._M_engaged;
    plVar2 = std::optional<long>::value((optional<long> *)in_stack_ffffffffffffd5b8);
    local_11c8._0_8_ = (_func_int **)0x3e8;
    in_stack_ffffffffffffd5b8 = "COIN/100000";
    in_stack_ffffffffffffd5b0 = (lazy_ostream *)local_11c8;
    in_stack_ffffffffffffd5a8 = "ParseMoney(\"0.00001\").value()";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,long>
              (local_11a8,local_11b8,0x194,1,2,plVar2);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffd5a8);
    std::allocator<char>::~allocator((allocator<char> *)(local_11c8 + 0xf));
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffd5a8);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd5b8,
               (pointer)in_stack_ffffffffffffd5b0,(unsigned_long)in_stack_ffffffffffffd5a8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd5a8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffd5e8,in_stack_ffffffffffffd5e0,
               in_stack_ffffffffffffd5d8,(const_string *)in_stack_ffffffffffffd5d0);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_ffffffffffffd5b0,(char (*) [1])in_stack_ffffffffffffd5a8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd5b8,
               (pointer)in_stack_ffffffffffffd5b0,(unsigned_long)in_stack_ffffffffffffd5a8);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_stack_ffffffffffffd5ff,in_stack_ffffffffffffd5f8),
               in_stack_ffffffffffffd5f0,in_stack_ffffffffffffd5e8);
    oVar3 = ParseMoney(in_stack_ffffffffffffd660);
    local_798._M_value =
         oVar3.super__Optional_base<long,_true,_true>._M_payload.super__Optional_payload_base<long>.
         _M_payload;
    local_790 = oVar3.super__Optional_base<long,_true,_true>._M_payload.
                super__Optional_payload_base<long>._M_engaged;
    plVar2 = std::optional<long>::value((optional<long> *)in_stack_ffffffffffffd5b8);
    local_1228._0_8_ = (_func_int **)0x64;
    in_stack_ffffffffffffd5b8 = "COIN/1000000";
    in_stack_ffffffffffffd5b0 = (lazy_ostream *)local_1228;
    in_stack_ffffffffffffd5a8 = "ParseMoney(\"0.000001\").value()";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,long>
              (local_1208,local_1218,0x195,1,2,plVar2);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffd5a8);
    std::allocator<char>::~allocator((allocator<char> *)(local_1228 + 0xf));
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffd5a8);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd5b8,
               (pointer)in_stack_ffffffffffffd5b0,(unsigned_long)in_stack_ffffffffffffd5a8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd5a8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffd5e8,in_stack_ffffffffffffd5e0,
               in_stack_ffffffffffffd5d8,(const_string *)in_stack_ffffffffffffd5d0);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_ffffffffffffd5b0,(char (*) [1])in_stack_ffffffffffffd5a8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd5b8,
               (pointer)in_stack_ffffffffffffd5b0,(unsigned_long)in_stack_ffffffffffffd5a8);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_stack_ffffffffffffd5ff,in_stack_ffffffffffffd5f8),
               in_stack_ffffffffffffd5f0,in_stack_ffffffffffffd5e8);
    oVar3 = ParseMoney(in_stack_ffffffffffffd660);
    local_7a8._M_value =
         oVar3.super__Optional_base<long,_true,_true>._M_payload.super__Optional_payload_base<long>.
         _M_payload;
    local_7a0 = oVar3.super__Optional_base<long,_true,_true>._M_payload.
                super__Optional_payload_base<long>._M_engaged;
    plVar2 = std::optional<long>::value((optional<long> *)in_stack_ffffffffffffd5b8);
    local_1288._0_8_ = (_func_int **)0xa;
    in_stack_ffffffffffffd5b8 = "COIN/10000000";
    in_stack_ffffffffffffd5b0 = (lazy_ostream *)local_1288;
    in_stack_ffffffffffffd5a8 = "ParseMoney(\"0.0000001\").value()";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,long>
              (local_1268,local_1278,0x196,1,2,plVar2);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffd5a8);
    std::allocator<char>::~allocator((allocator<char> *)(local_1288 + 0xf));
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffd5a8);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd5b8,
               (pointer)in_stack_ffffffffffffd5b0,(unsigned_long)in_stack_ffffffffffffd5a8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd5a8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffd5e8,in_stack_ffffffffffffd5e0,
               in_stack_ffffffffffffd5d8,(const_string *)in_stack_ffffffffffffd5d0);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_ffffffffffffd5b0,(char (*) [1])in_stack_ffffffffffffd5a8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd5b8,
               (pointer)in_stack_ffffffffffffd5b0,(unsigned_long)in_stack_ffffffffffffd5a8);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_stack_ffffffffffffd5ff,in_stack_ffffffffffffd5f8),
               in_stack_ffffffffffffd5f0,in_stack_ffffffffffffd5e8);
    oVar3 = ParseMoney(in_stack_ffffffffffffd660);
    local_7b8._M_value =
         oVar3.super__Optional_base<long,_true,_true>._M_payload.super__Optional_payload_base<long>.
         _M_payload;
    local_7b0 = oVar3.super__Optional_base<long,_true,_true>._M_payload.
                super__Optional_payload_base<long>._M_engaged;
    plVar2 = std::optional<long>::value((optional<long> *)in_stack_ffffffffffffd5b8);
    local_12e8._0_8_ = (_func_int **)0x1;
    in_stack_ffffffffffffd5b8 = "COIN/100000000";
    in_stack_ffffffffffffd5b0 = (lazy_ostream *)local_12e8;
    in_stack_ffffffffffffd5a8 = "ParseMoney(\"0.00000001\").value()";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,long>
              (local_12c8,local_12d8,0x197,1,2,plVar2);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffd5a8);
    std::allocator<char>::~allocator((allocator<char> *)(local_12e8 + 0xf));
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffd5a8);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd5b8,
               (pointer)in_stack_ffffffffffffd5b0,(unsigned_long)in_stack_ffffffffffffd5a8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd5a8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffd5e8,in_stack_ffffffffffffd5e0,
               in_stack_ffffffffffffd5d8,(const_string *)in_stack_ffffffffffffd5d0);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_ffffffffffffd5b0,(char (*) [1])in_stack_ffffffffffffd5a8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd5b8,
               (pointer)in_stack_ffffffffffffd5b0,(unsigned_long)in_stack_ffffffffffffd5a8);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_stack_ffffffffffffd5ff,in_stack_ffffffffffffd5f8),
               in_stack_ffffffffffffd5f0,in_stack_ffffffffffffd5e8);
    oVar3 = ParseMoney(in_stack_ffffffffffffd660);
    local_7c8._M_value =
         oVar3.super__Optional_base<long,_true,_true>._M_payload.super__Optional_payload_base<long>.
         _M_payload;
    local_7c0 = oVar3.super__Optional_base<long,_true,_true>._M_payload.
                super__Optional_payload_base<long>._M_engaged;
    plVar2 = std::optional<long>::value((optional<long> *)in_stack_ffffffffffffd5b8);
    local_1348._0_8_ = (_func_int **)0x1;
    in_stack_ffffffffffffd5b8 = "COIN/100000000";
    in_stack_ffffffffffffd5b0 = (lazy_ostream *)local_1348;
    in_stack_ffffffffffffd5a8 = "ParseMoney(\" 0.00000001 \").value()";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,long>
              (local_1328,local_1338,0x198,1,2,plVar2);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffd5a8);
    std::allocator<char>::~allocator((allocator<char> *)(local_1348 + 0xf));
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffd5a8);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd5b8,
               (pointer)in_stack_ffffffffffffd5b0,(unsigned_long)in_stack_ffffffffffffd5a8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd5a8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffd5e8,in_stack_ffffffffffffd5e0,
               in_stack_ffffffffffffd5d8,(const_string *)in_stack_ffffffffffffd5d0);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_ffffffffffffd5b0,(char (*) [1])in_stack_ffffffffffffd5a8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd5b8,
               (pointer)in_stack_ffffffffffffd5b0,(unsigned_long)in_stack_ffffffffffffd5a8);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_stack_ffffffffffffd5ff,in_stack_ffffffffffffd5f8),
               in_stack_ffffffffffffd5f0,in_stack_ffffffffffffd5e8);
    oVar3 = ParseMoney(in_stack_ffffffffffffd660);
    local_7d8._M_value =
         oVar3.super__Optional_base<long,_true,_true>._M_payload.super__Optional_payload_base<long>.
         _M_payload;
    local_7d0 = oVar3.super__Optional_base<long,_true,_true>._M_payload.
                super__Optional_payload_base<long>._M_engaged;
    plVar2 = std::optional<long>::value((optional<long> *)in_stack_ffffffffffffd5b8);
    local_13a8._0_8_ = (_func_int **)0x1;
    in_stack_ffffffffffffd5b8 = "COIN/100000000";
    in_stack_ffffffffffffd5b0 = (lazy_ostream *)local_13a8;
    in_stack_ffffffffffffd5a8 = "ParseMoney(\"0.00000001 \").value()";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,long>
              (local_1388,local_1398,0x199,1,2,plVar2);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffd5a8);
    std::allocator<char>::~allocator((allocator<char> *)(local_13a8 + 0xf));
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffd5a8);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd5b8,
               (pointer)in_stack_ffffffffffffd5b0,(unsigned_long)in_stack_ffffffffffffd5a8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd5a8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffd5e8,in_stack_ffffffffffffd5e0,
               in_stack_ffffffffffffd5d8,(const_string *)in_stack_ffffffffffffd5d0);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_ffffffffffffd5b0,(char (*) [1])in_stack_ffffffffffffd5a8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd5b8,
               (pointer)in_stack_ffffffffffffd5b0,(unsigned_long)in_stack_ffffffffffffd5a8);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_stack_ffffffffffffd5ff,in_stack_ffffffffffffd5f8),
               in_stack_ffffffffffffd5f0,in_stack_ffffffffffffd5e8);
    oVar3 = ParseMoney(in_stack_ffffffffffffd660);
    local_7e8._M_value =
         oVar3.super__Optional_base<long,_true,_true>._M_payload.super__Optional_payload_base<long>.
         _M_payload;
    local_7e0 = oVar3.super__Optional_base<long,_true,_true>._M_payload.
                super__Optional_payload_base<long>._M_engaged;
    plVar2 = std::optional<long>::value((optional<long> *)in_stack_ffffffffffffd5b8);
    local_1408._0_8_ = (_func_int **)0x1;
    in_stack_ffffffffffffd5b8 = "COIN/100000000";
    in_stack_ffffffffffffd5b0 = (lazy_ostream *)local_1408;
    in_stack_ffffffffffffd5a8 = "ParseMoney(\" 0.00000001\").value()";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,long>
              (local_13e8,local_13f8,0x19a,1,2,plVar2);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffd5a8);
    std::allocator<char>::~allocator((allocator<char> *)(local_1408 + 0xf));
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffd5a8);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd5b8,
               (pointer)in_stack_ffffffffffffd5b0,(unsigned_long)in_stack_ffffffffffffd5a8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd5a8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffd5e8,in_stack_ffffffffffffd5e0,
               in_stack_ffffffffffffd5d8,(const_string *)in_stack_ffffffffffffd5d0);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_stack_ffffffffffffd5ff,in_stack_ffffffffffffd5f8),
               in_stack_ffffffffffffd5f0,in_stack_ffffffffffffd5e8);
    oVar3 = ParseMoney(in_stack_ffffffffffffd660);
    local_7f8._M_value =
         oVar3.super__Optional_base<long,_true,_true>._M_payload.super__Optional_payload_base<long>.
         _M_payload;
    local_7f0 = oVar3.super__Optional_base<long,_true,_true>._M_payload.
                super__Optional_payload_base<long>._M_engaged;
    std::optional::operator_cast_to_bool((optional<long> *)in_stack_ffffffffffffd5a8);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_ffffffffffffd5b8,
               SUB81((ulong)in_stack_ffffffffffffd5b0 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd5b8,
               (pointer)in_stack_ffffffffffffd5b0,(unsigned_long)in_stack_ffffffffffffd5a8);
    boost::unit_test::operator<<
              (in_stack_ffffffffffffd5b0,(basic_cstring<const_char> *)in_stack_ffffffffffffd5a8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd5b8,
               (pointer)in_stack_ffffffffffffd5b0,(unsigned_long)in_stack_ffffffffffffd5a8);
    in_stack_ffffffffffffd5a8 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_1440,local_1468,local_1488,0x19d,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffd5a8);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffd5a8);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffd5a8);
    std::allocator<char>::~allocator(&local_1441);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd5b8,
               (pointer)in_stack_ffffffffffffd5b0,(unsigned_long)in_stack_ffffffffffffd5a8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd5a8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffd5e8,in_stack_ffffffffffffd5e0,
               in_stack_ffffffffffffd5d8,(const_string *)in_stack_ffffffffffffd5d0);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_stack_ffffffffffffd5ff,in_stack_ffffffffffffd5f8),
               in_stack_ffffffffffffd5f0,in_stack_ffffffffffffd5e8);
    oVar3 = ParseMoney(in_stack_ffffffffffffd660);
    local_808._M_value =
         oVar3.super__Optional_base<long,_true,_true>._M_payload.super__Optional_payload_base<long>.
         _M_payload;
    local_800 = oVar3.super__Optional_base<long,_true,_true>._M_payload.
                super__Optional_payload_base<long>._M_engaged;
    std::optional::operator_cast_to_bool((optional<long> *)in_stack_ffffffffffffd5a8);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_ffffffffffffd5b8,
               SUB81((ulong)in_stack_ffffffffffffd5b0 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd5b8,
               (pointer)in_stack_ffffffffffffd5b0,(unsigned_long)in_stack_ffffffffffffd5a8);
    boost::unit_test::operator<<
              (in_stack_ffffffffffffd5b0,(basic_cstring<const_char> *)in_stack_ffffffffffffd5a8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd5b8,
               (pointer)in_stack_ffffffffffffd5b0,(unsigned_long)in_stack_ffffffffffffd5a8);
    in_stack_ffffffffffffd5a8 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_14c0,local_14e8,local_1508,0x19e,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffd5a8);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffd5a8);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffd5a8);
    std::allocator<char>::~allocator(&local_14c1);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd5b8,
               (pointer)in_stack_ffffffffffffd5b0,(unsigned_long)in_stack_ffffffffffffd5a8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd5a8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffd5e8,in_stack_ffffffffffffd5e0,
               in_stack_ffffffffffffd5d8,(const_string *)in_stack_ffffffffffffd5d0);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_stack_ffffffffffffd5ff,in_stack_ffffffffffffd5f8),
               in_stack_ffffffffffffd5f0,in_stack_ffffffffffffd5e8);
    oVar3 = ParseMoney(in_stack_ffffffffffffd660);
    local_818._M_value =
         oVar3.super__Optional_base<long,_true,_true>._M_payload.super__Optional_payload_base<long>.
         _M_payload;
    local_810 = oVar3.super__Optional_base<long,_true,_true>._M_payload.
                super__Optional_payload_base<long>._M_engaged;
    std::optional::operator_cast_to_bool((optional<long> *)in_stack_ffffffffffffd5a8);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_ffffffffffffd5b8,
               SUB81((ulong)in_stack_ffffffffffffd5b0 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd5b8,
               (pointer)in_stack_ffffffffffffd5b0,(unsigned_long)in_stack_ffffffffffffd5a8);
    boost::unit_test::operator<<
              (in_stack_ffffffffffffd5b0,(basic_cstring<const_char> *)in_stack_ffffffffffffd5a8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd5b8,
               (pointer)in_stack_ffffffffffffd5b0,(unsigned_long)in_stack_ffffffffffffd5a8);
    in_stack_ffffffffffffd5a8 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_1540,local_1568,local_1588,0x1a1,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffd5a8);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffd5a8);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffd5a8);
    std::allocator<char>::~allocator(&local_1541);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd5b8,
               (pointer)in_stack_ffffffffffffd5b0,(unsigned_long)in_stack_ffffffffffffd5a8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd5a8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffd5e8,in_stack_ffffffffffffd5e0,
               in_stack_ffffffffffffd5d8,(const_string *)in_stack_ffffffffffffd5d0);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_stack_ffffffffffffd5ff,in_stack_ffffffffffffd5f8),
               in_stack_ffffffffffffd5f0,in_stack_ffffffffffffd5e8);
    oVar3 = ParseMoney(in_stack_ffffffffffffd660);
    local_828._M_value =
         oVar3.super__Optional_base<long,_true,_true>._M_payload.super__Optional_payload_base<long>.
         _M_payload;
    local_820 = oVar3.super__Optional_base<long,_true,_true>._M_payload.
                super__Optional_payload_base<long>._M_engaged;
    std::optional::operator_cast_to_bool((optional<long> *)in_stack_ffffffffffffd5a8);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_ffffffffffffd5b8,
               SUB81((ulong)in_stack_ffffffffffffd5b0 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd5b8,
               (pointer)in_stack_ffffffffffffd5b0,(unsigned_long)in_stack_ffffffffffffd5a8);
    boost::unit_test::operator<<
              (in_stack_ffffffffffffd5b0,(basic_cstring<const_char> *)in_stack_ffffffffffffd5a8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd5b8,
               (pointer)in_stack_ffffffffffffd5b0,(unsigned_long)in_stack_ffffffffffffd5a8);
    in_stack_ffffffffffffd5a8 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_15c0,local_15e8,local_1608,0x1a2,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffd5a8);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffd5a8);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffd5a8);
    std::allocator<char>::~allocator(&local_15c1);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd5b8,
               (pointer)in_stack_ffffffffffffd5b0,(unsigned_long)in_stack_ffffffffffffd5a8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd5a8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffd5e8,in_stack_ffffffffffffd5e0,
               in_stack_ffffffffffffd5d8,(const_string *)in_stack_ffffffffffffd5d0);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_stack_ffffffffffffd5ff,in_stack_ffffffffffffd5f8),
               in_stack_ffffffffffffd5f0,in_stack_ffffffffffffd5e8);
    oVar3 = ParseMoney(in_stack_ffffffffffffd660);
    local_838._M_value =
         oVar3.super__Optional_base<long,_true,_true>._M_payload.super__Optional_payload_base<long>.
         _M_payload;
    local_830 = oVar3.super__Optional_base<long,_true,_true>._M_payload.
                super__Optional_payload_base<long>._M_engaged;
    std::optional::operator_cast_to_bool((optional<long> *)in_stack_ffffffffffffd5a8);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_ffffffffffffd5b8,
               SUB81((ulong)in_stack_ffffffffffffd5b0 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd5b8,
               (pointer)in_stack_ffffffffffffd5b0,(unsigned_long)in_stack_ffffffffffffd5a8);
    boost::unit_test::operator<<
              (in_stack_ffffffffffffd5b0,(basic_cstring<const_char> *)in_stack_ffffffffffffd5a8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd5b8,
               (pointer)in_stack_ffffffffffffd5b0,(unsigned_long)in_stack_ffffffffffffd5a8);
    in_stack_ffffffffffffd5a8 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_1640,local_1668,local_1688,0x1a3,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffd5a8);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffd5a8);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffd5a8);
    std::allocator<char>::~allocator(&local_1641);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd5b8,
               (pointer)in_stack_ffffffffffffd5b0,(unsigned_long)in_stack_ffffffffffffd5a8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd5a8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffd5e8,in_stack_ffffffffffffd5e0,
               in_stack_ffffffffffffd5d8,(const_string *)in_stack_ffffffffffffd5d0);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_stack_ffffffffffffd5ff,in_stack_ffffffffffffd5f8),
               in_stack_ffffffffffffd5f0,in_stack_ffffffffffffd5e8);
    oVar3 = ParseMoney(in_stack_ffffffffffffd660);
    local_848._M_value =
         oVar3.super__Optional_base<long,_true,_true>._M_payload.super__Optional_payload_base<long>.
         _M_payload;
    local_840 = oVar3.super__Optional_base<long,_true,_true>._M_payload.
                super__Optional_payload_base<long>._M_engaged;
    std::optional::operator_cast_to_bool((optional<long> *)in_stack_ffffffffffffd5a8);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_ffffffffffffd5b8,
               SUB81((ulong)in_stack_ffffffffffffd5b0 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd5b8,
               (pointer)in_stack_ffffffffffffd5b0,(unsigned_long)in_stack_ffffffffffffd5a8);
    boost::unit_test::operator<<
              (in_stack_ffffffffffffd5b0,(basic_cstring<const_char> *)in_stack_ffffffffffffd5a8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd5b8,
               (pointer)in_stack_ffffffffffffd5b0,(unsigned_long)in_stack_ffffffffffffd5a8);
    in_stack_ffffffffffffd5a8 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_16c0,local_16e8,local_1708,0x1a6,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffd5a8);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffd5a8);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffd5a8);
    std::allocator<char>::~allocator(&local_16c1);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd5b8,
               (pointer)in_stack_ffffffffffffd5b0,(unsigned_long)in_stack_ffffffffffffd5a8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd5a8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffd5e8,in_stack_ffffffffffffd5e0,
               in_stack_ffffffffffffd5d8,(const_string *)in_stack_ffffffffffffd5d0);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_stack_ffffffffffffd5ff,in_stack_ffffffffffffd5f8),
               in_stack_ffffffffffffd5f0,in_stack_ffffffffffffd5e8);
    oVar3 = ParseMoney(in_stack_ffffffffffffd660);
    local_858._M_value =
         oVar3.super__Optional_base<long,_true,_true>._M_payload.super__Optional_payload_base<long>.
         _M_payload;
    local_850 = oVar3.super__Optional_base<long,_true,_true>._M_payload.
                super__Optional_payload_base<long>._M_engaged;
    std::optional::operator_cast_to_bool((optional<long> *)in_stack_ffffffffffffd5a8);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_ffffffffffffd5b8,
               SUB81((ulong)in_stack_ffffffffffffd5b0 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd5b8,
               (pointer)in_stack_ffffffffffffd5b0,(unsigned_long)in_stack_ffffffffffffd5a8);
    boost::unit_test::operator<<
              (in_stack_ffffffffffffd5b0,(basic_cstring<const_char> *)in_stack_ffffffffffffd5a8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd5b8,
               (pointer)in_stack_ffffffffffffd5b0,(unsigned_long)in_stack_ffffffffffffd5a8);
    in_stack_ffffffffffffd5a8 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_1740,local_1768,local_1788,0x1a7,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffd5a8);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffd5a8);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffd5a8);
    std::allocator<char>::~allocator(&local_1741);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd5b8,
               (pointer)in_stack_ffffffffffffd5b0,(unsigned_long)in_stack_ffffffffffffd5a8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd5a8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffd5e8,in_stack_ffffffffffffd5e0,
               in_stack_ffffffffffffd5d8,(const_string *)in_stack_ffffffffffffd5d0);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_stack_ffffffffffffd5ff,in_stack_ffffffffffffd5f8),
               in_stack_ffffffffffffd5f0,in_stack_ffffffffffffd5e8);
    oVar3 = ParseMoney(in_stack_ffffffffffffd660);
    local_868._M_value =
         oVar3.super__Optional_base<long,_true,_true>._M_payload.super__Optional_payload_base<long>.
         _M_payload;
    local_860 = oVar3.super__Optional_base<long,_true,_true>._M_payload.
                super__Optional_payload_base<long>._M_engaged;
    std::optional::operator_cast_to_bool((optional<long> *)in_stack_ffffffffffffd5a8);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_ffffffffffffd5b8,
               SUB81((ulong)in_stack_ffffffffffffd5b0 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd5b8,
               (pointer)in_stack_ffffffffffffd5b0,(unsigned_long)in_stack_ffffffffffffd5a8);
    boost::unit_test::operator<<
              (in_stack_ffffffffffffd5b0,(basic_cstring<const_char> *)in_stack_ffffffffffffd5a8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd5b8,
               (pointer)in_stack_ffffffffffffd5b0,(unsigned_long)in_stack_ffffffffffffd5a8);
    in_stack_ffffffffffffd5a8 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_17c0,local_17e8,local_1808,0x1a8,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffd5a8);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffd5a8);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffd5a8);
    std::allocator<char>::~allocator(&local_17c1);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd5b8,
               (pointer)in_stack_ffffffffffffd5b0,(unsigned_long)in_stack_ffffffffffffd5a8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd5a8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffd5e8,in_stack_ffffffffffffd5e0,
               in_stack_ffffffffffffd5d8,(const_string *)in_stack_ffffffffffffd5d0);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_stack_ffffffffffffd5ff,in_stack_ffffffffffffd5f8),
               in_stack_ffffffffffffd5f0,in_stack_ffffffffffffd5e8);
    oVar3 = ParseMoney(in_stack_ffffffffffffd660);
    local_878._M_value =
         oVar3.super__Optional_base<long,_true,_true>._M_payload.super__Optional_payload_base<long>.
         _M_payload;
    local_870 = oVar3.super__Optional_base<long,_true,_true>._M_payload.
                super__Optional_payload_base<long>._M_engaged;
    std::optional::operator_cast_to_bool((optional<long> *)in_stack_ffffffffffffd5a8);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_ffffffffffffd5b8,
               SUB81((ulong)in_stack_ffffffffffffd5b0 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd5b8,
               (pointer)in_stack_ffffffffffffd5b0,(unsigned_long)in_stack_ffffffffffffd5a8);
    boost::unit_test::operator<<
              (in_stack_ffffffffffffd5b0,(basic_cstring<const_char> *)in_stack_ffffffffffffd5a8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd5b8,
               (pointer)in_stack_ffffffffffffd5b0,(unsigned_long)in_stack_ffffffffffffd5a8);
    in_stack_ffffffffffffd5a8 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_1840,local_1868,local_1888,0x1a9,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffd5a8);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffd5a8);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffd5a8);
    std::allocator<char>::~allocator(&local_1841);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd5b8,
               (pointer)in_stack_ffffffffffffd5b0,(unsigned_long)in_stack_ffffffffffffd5a8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd5a8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffd5e8,in_stack_ffffffffffffd5e0,
               in_stack_ffffffffffffd5d8,(const_string *)in_stack_ffffffffffffd5d0);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_stack_ffffffffffffd5ff,in_stack_ffffffffffffd5f8),
               in_stack_ffffffffffffd5f0,in_stack_ffffffffffffd5e8);
    oVar3 = ParseMoney(in_stack_ffffffffffffd660);
    local_888._M_value =
         oVar3.super__Optional_base<long,_true,_true>._M_payload.super__Optional_payload_base<long>.
         _M_payload;
    local_880 = oVar3.super__Optional_base<long,_true,_true>._M_payload.
                super__Optional_payload_base<long>._M_engaged;
    std::optional::operator_cast_to_bool((optional<long> *)in_stack_ffffffffffffd5a8);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_ffffffffffffd5b8,
               SUB81((ulong)in_stack_ffffffffffffd5b0 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd5b8,
               (pointer)in_stack_ffffffffffffd5b0,(unsigned_long)in_stack_ffffffffffffd5a8);
    boost::unit_test::operator<<
              (in_stack_ffffffffffffd5b0,(basic_cstring<const_char> *)in_stack_ffffffffffffd5a8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd5b8,
               (pointer)in_stack_ffffffffffffd5b0,(unsigned_long)in_stack_ffffffffffffd5a8);
    in_stack_ffffffffffffd5a8 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_18c0,local_18e8,local_1908,0x1aa,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffd5a8);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffd5a8);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffd5a8);
    std::allocator<char>::~allocator(&local_18c1);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd5b8,
               (pointer)in_stack_ffffffffffffd5b0,(unsigned_long)in_stack_ffffffffffffd5a8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd5a8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffd5e8,in_stack_ffffffffffffd5e0,
               in_stack_ffffffffffffd5d8,(const_string *)in_stack_ffffffffffffd5d0);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_stack_ffffffffffffd5ff,in_stack_ffffffffffffd5f8),
               in_stack_ffffffffffffd5f0,in_stack_ffffffffffffd5e8);
    oVar3 = ParseMoney(in_stack_ffffffffffffd660);
    local_898._M_value =
         oVar3.super__Optional_base<long,_true,_true>._M_payload.super__Optional_payload_base<long>.
         _M_payload;
    local_890 = oVar3.super__Optional_base<long,_true,_true>._M_payload.
                super__Optional_payload_base<long>._M_engaged;
    std::optional::operator_cast_to_bool((optional<long> *)in_stack_ffffffffffffd5a8);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_ffffffffffffd5b8,
               SUB81((ulong)in_stack_ffffffffffffd5b0 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd5b8,
               (pointer)in_stack_ffffffffffffd5b0,(unsigned_long)in_stack_ffffffffffffd5a8);
    boost::unit_test::operator<<
              (in_stack_ffffffffffffd5b0,(basic_cstring<const_char> *)in_stack_ffffffffffffd5a8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd5b8,
               (pointer)in_stack_ffffffffffffd5b0,(unsigned_long)in_stack_ffffffffffffd5a8);
    in_stack_ffffffffffffd5a8 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_1940,local_1968,local_1988,0x1ab,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffd5a8);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffd5a8);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffd5a8);
    std::allocator<char>::~allocator(&local_1941);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd5b8,
               (pointer)in_stack_ffffffffffffd5b0,(unsigned_long)in_stack_ffffffffffffd5a8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd5a8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffd5e8,in_stack_ffffffffffffd5e0,
               in_stack_ffffffffffffd5d8,(const_string *)in_stack_ffffffffffffd5d0);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_stack_ffffffffffffd5ff,in_stack_ffffffffffffd5f8),
               in_stack_ffffffffffffd5f0,in_stack_ffffffffffffd5e8);
    oVar3 = ParseMoney(in_stack_ffffffffffffd660);
    local_8a8._M_value =
         oVar3.super__Optional_base<long,_true,_true>._M_payload.super__Optional_payload_base<long>.
         _M_payload;
    local_8a0 = oVar3.super__Optional_base<long,_true,_true>._M_payload.
                super__Optional_payload_base<long>._M_engaged;
    std::optional::operator_cast_to_bool((optional<long> *)in_stack_ffffffffffffd5a8);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_ffffffffffffd5b8,
               SUB81((ulong)in_stack_ffffffffffffd5b0 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd5b8,
               (pointer)in_stack_ffffffffffffd5b0,(unsigned_long)in_stack_ffffffffffffd5a8);
    boost::unit_test::operator<<
              (in_stack_ffffffffffffd5b0,(basic_cstring<const_char> *)in_stack_ffffffffffffd5a8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd5b8,
               (pointer)in_stack_ffffffffffffd5b0,(unsigned_long)in_stack_ffffffffffffd5a8);
    in_stack_ffffffffffffd5a8 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_19c0,local_19e8,local_1a08,0x1ae,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffd5a8);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffd5a8);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffd5a8);
    std::allocator<char>::~allocator(&local_19c1);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd5b8,
               (pointer)in_stack_ffffffffffffd5b0,(unsigned_long)in_stack_ffffffffffffd5a8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd5a8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffd5e8,in_stack_ffffffffffffd5e0,
               in_stack_ffffffffffffd5d8,(const_string *)in_stack_ffffffffffffd5d0);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_stack_ffffffffffffd5ff,in_stack_ffffffffffffd5f8),
               in_stack_ffffffffffffd5f0,in_stack_ffffffffffffd5e8);
    oVar3 = ParseMoney(in_stack_ffffffffffffd660);
    local_8b8._M_value =
         oVar3.super__Optional_base<long,_true,_true>._M_payload.super__Optional_payload_base<long>.
         _M_payload;
    local_8b0 = oVar3.super__Optional_base<long,_true,_true>._M_payload.
                super__Optional_payload_base<long>._M_engaged;
    std::optional::operator_cast_to_bool((optional<long> *)in_stack_ffffffffffffd5a8);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_ffffffffffffd5b8,
               SUB81((ulong)in_stack_ffffffffffffd5b0 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd5b8,
               (pointer)in_stack_ffffffffffffd5b0,(unsigned_long)in_stack_ffffffffffffd5a8);
    boost::unit_test::operator<<
              (in_stack_ffffffffffffd5b0,(basic_cstring<const_char> *)in_stack_ffffffffffffd5a8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd5b8,
               (pointer)in_stack_ffffffffffffd5b0,(unsigned_long)in_stack_ffffffffffffd5a8);
    in_stack_ffffffffffffd5a8 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_1a40,local_1a68,local_1a88,0x1af,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffd5a8);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffd5a8);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffd5a8);
    std::allocator<char>::~allocator(&local_1a41);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd5b8,
               (pointer)in_stack_ffffffffffffd5b0,(unsigned_long)in_stack_ffffffffffffd5a8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd5a8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffd5e8,in_stack_ffffffffffffd5e0,
               in_stack_ffffffffffffd5d8,(const_string *)in_stack_ffffffffffffd5d0);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_stack_ffffffffffffd5ff,in_stack_ffffffffffffd5f8),
               in_stack_ffffffffffffd5f0,in_stack_ffffffffffffd5e8);
    oVar3 = ParseMoney(in_stack_ffffffffffffd660);
    local_8c8._M_value =
         oVar3.super__Optional_base<long,_true,_true>._M_payload.super__Optional_payload_base<long>.
         _M_payload;
    local_8c0 = oVar3.super__Optional_base<long,_true,_true>._M_payload.
                super__Optional_payload_base<long>._M_engaged;
    std::optional::operator_cast_to_bool((optional<long> *)in_stack_ffffffffffffd5a8);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_ffffffffffffd5b8,
               SUB81((ulong)in_stack_ffffffffffffd5b0 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd5b8,
               (pointer)in_stack_ffffffffffffd5b0,(unsigned_long)in_stack_ffffffffffffd5a8);
    boost::unit_test::operator<<
              (in_stack_ffffffffffffd5b0,(basic_cstring<const_char> *)in_stack_ffffffffffffd5a8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd5b8,
               (pointer)in_stack_ffffffffffffd5b0,(unsigned_long)in_stack_ffffffffffffd5a8);
    in_stack_ffffffffffffd5a8 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_1ac0,local_1ae8,local_1b08,0x1b0,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffd5a8);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffd5a8);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffd5a8);
    std::allocator<char>::~allocator(&local_1ac1);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd5b8,
               (pointer)in_stack_ffffffffffffd5b0,(unsigned_long)in_stack_ffffffffffffd5a8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd5a8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffd5e8,in_stack_ffffffffffffd5e0,
               in_stack_ffffffffffffd5d8,(const_string *)in_stack_ffffffffffffd5d0);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_stack_ffffffffffffd5ff,in_stack_ffffffffffffd5f8),
               in_stack_ffffffffffffd5f0,in_stack_ffffffffffffd5e8);
    oVar3 = ParseMoney(in_stack_ffffffffffffd660);
    local_8d8._M_value =
         oVar3.super__Optional_base<long,_true,_true>._M_payload.super__Optional_payload_base<long>.
         _M_payload;
    local_8d0 = oVar3.super__Optional_base<long,_true,_true>._M_payload.
                super__Optional_payload_base<long>._M_engaged;
    std::optional::operator_cast_to_bool((optional<long> *)in_stack_ffffffffffffd5a8);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_ffffffffffffd5b8,
               SUB81((ulong)in_stack_ffffffffffffd5b0 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd5b8,
               (pointer)in_stack_ffffffffffffd5b0,(unsigned_long)in_stack_ffffffffffffd5a8);
    boost::unit_test::operator<<
              (in_stack_ffffffffffffd5b0,(basic_cstring<const_char> *)in_stack_ffffffffffffd5a8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd5b8,
               (pointer)in_stack_ffffffffffffd5b0,(unsigned_long)in_stack_ffffffffffffd5a8);
    in_stack_ffffffffffffd5a8 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_1b40,local_1b68,local_1b88,0x1b3,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffd5a8);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffd5a8);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffd5a8);
    std::allocator<char>::~allocator(&local_1b41);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd5b8,
               (pointer)in_stack_ffffffffffffd5b0,(unsigned_long)in_stack_ffffffffffffd5a8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd5a8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffd5e8,in_stack_ffffffffffffd5e0,
               in_stack_ffffffffffffd5d8,(const_string *)in_stack_ffffffffffffd5d0);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_stack_ffffffffffffd5ff,in_stack_ffffffffffffd5f8),
               in_stack_ffffffffffffd5f0,in_stack_ffffffffffffd5e8);
    oVar3 = ParseMoney(in_stack_ffffffffffffd660);
    local_8e8._M_value =
         oVar3.super__Optional_base<long,_true,_true>._M_payload.super__Optional_payload_base<long>.
         _M_payload;
    local_8e0 = oVar3.super__Optional_base<long,_true,_true>._M_payload.
                super__Optional_payload_base<long>._M_engaged;
    std::optional::operator_cast_to_bool((optional<long> *)in_stack_ffffffffffffd5a8);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_ffffffffffffd5b8,
               SUB81((ulong)in_stack_ffffffffffffd5b0 >> 0x38,0));
    in_stack_ffffffffffffd660 = (string *)boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd5b8,
               (pointer)in_stack_ffffffffffffd5b0,(unsigned_long)in_stack_ffffffffffffd5a8);
    boost::unit_test::operator<<
              (in_stack_ffffffffffffd5b0,(basic_cstring<const_char> *)in_stack_ffffffffffffd5a8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd5b8,
               (pointer)in_stack_ffffffffffffd5b0,(unsigned_long)in_stack_ffffffffffffd5a8);
    in_stack_ffffffffffffd5a8 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_1bc0,local_1be8,local_1c08,0x1b6,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffd5a8);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffd5a8);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffd5a8);
    std::allocator<char>::~allocator(&local_1bc1);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd5b8,
               (pointer)in_stack_ffffffffffffd5b0,(unsigned_long)in_stack_ffffffffffffd5a8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd5a8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffd5e8,in_stack_ffffffffffffd5e0,
               in_stack_ffffffffffffd5d8,(const_string *)in_stack_ffffffffffffd5d0);
    s_abi_cxx11_((char *)in_stack_ffffffffffffd5e8,(size_t)in_stack_ffffffffffffd5e0);
    oVar3 = ParseMoney(in_stack_ffffffffffffd660);
    local_8f8._M_value =
         oVar3.super__Optional_base<long,_true,_true>._M_payload.super__Optional_payload_base<long>.
         _M_payload;
    local_8f0 = oVar3.super__Optional_base<long,_true,_true>._M_payload.
                super__Optional_payload_base<long>._M_engaged;
    std::optional::operator_cast_to_bool((optional<long> *)in_stack_ffffffffffffd5a8);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_ffffffffffffd5b8,
               SUB81((ulong)in_stack_ffffffffffffd5b0 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd5b8,
               (pointer)in_stack_ffffffffffffd5b0,(unsigned_long)in_stack_ffffffffffffd5a8);
    boost::unit_test::operator<<
              (in_stack_ffffffffffffd5b0,(basic_cstring<const_char> *)in_stack_ffffffffffffd5a8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd5b8,
               (pointer)in_stack_ffffffffffffd5b0,(unsigned_long)in_stack_ffffffffffffd5a8);
    in_stack_ffffffffffffd5a8 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_1c40,local_1c60,local_1c80,0x1b9,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffd5a8);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffd5a8);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffd5a8);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd5b8,
               (pointer)in_stack_ffffffffffffd5b0,(unsigned_long)in_stack_ffffffffffffd5a8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd5a8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffd5e8,in_stack_ffffffffffffd5e0,
               in_stack_ffffffffffffd5d8,(const_string *)in_stack_ffffffffffffd5d0);
    oVar3 = ParseMoney(in_stack_ffffffffffffd660);
    local_908._M_value =
         oVar3.super__Optional_base<long,_true,_true>._M_payload.super__Optional_payload_base<long>.
         _M_payload;
    local_900 = oVar3.super__Optional_base<long,_true,_true>._M_payload.
                super__Optional_payload_base<long>._M_engaged;
    std::optional::operator_cast_to_bool((optional<long> *)in_stack_ffffffffffffd5a8);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_ffffffffffffd5b8,
               SUB81((ulong)in_stack_ffffffffffffd5b0 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd5b8,
               (pointer)in_stack_ffffffffffffd5b0,(unsigned_long)in_stack_ffffffffffffd5a8);
    boost::unit_test::operator<<
              (in_stack_ffffffffffffd5b0,(basic_cstring<const_char> *)in_stack_ffffffffffffd5a8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd5b8,
               (pointer)in_stack_ffffffffffffd5b0,(unsigned_long)in_stack_ffffffffffffd5a8);
    in_stack_ffffffffffffd5a8 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_1cb8,local_1cd8,local_1cf8,0x1ba,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffd5a8);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffd5a8);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    file = &local_1d08;
    line_num = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd5b8,
               (pointer)in_stack_ffffffffffffd5b0,(unsigned_long)in_stack_ffffffffffffd5a8);
    this_00 = local_1d18;
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd5a8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (this_00,file,line_num,(const_string *)in_stack_ffffffffffffd5d0);
    s_abi_cxx11_((char *)this_00,(size_t)file);
    oVar3 = ParseMoney(in_stack_ffffffffffffd660);
    local_918._M_value =
         oVar3.super__Optional_base<long,_true,_true>._M_payload.super__Optional_payload_base<long>.
         _M_payload;
    local_910 = oVar3.super__Optional_base<long,_true,_true>._M_payload.
                super__Optional_payload_base<long>._M_engaged;
    std::optional::operator_cast_to_bool((optional<long> *)in_stack_ffffffffffffd5a8);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_ffffffffffffd5b8,
               SUB81((ulong)in_stack_ffffffffffffd5b0 >> 0x38,0));
    in_stack_ffffffffffffd5d0 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd5b8,
               (pointer)in_stack_ffffffffffffd5b0,(unsigned_long)in_stack_ffffffffffffd5a8);
    boost::unit_test::operator<<
              (in_stack_ffffffffffffd5b0,(basic_cstring<const_char> *)in_stack_ffffffffffffd5a8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd5b8,
               (pointer)in_stack_ffffffffffffd5b0,(unsigned_long)in_stack_ffffffffffffd5a8);
    in_stack_ffffffffffffd5a8 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (&local_1d30,local_1d50,local_1d70,0x1bb,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffd5a8);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffd5a8);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffd5a8);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(util_ParseMoney)
{
    BOOST_CHECK_EQUAL(ParseMoney("0.0").value(), 0);
    BOOST_CHECK_EQUAL(ParseMoney(".").value(), 0);
    BOOST_CHECK_EQUAL(ParseMoney("0.").value(), 0);
    BOOST_CHECK_EQUAL(ParseMoney(".0").value(), 0);
    BOOST_CHECK_EQUAL(ParseMoney(".6789").value(), 6789'0000);
    BOOST_CHECK_EQUAL(ParseMoney("12345.").value(), COIN * 12345);

    BOOST_CHECK_EQUAL(ParseMoney("12345.6789").value(), (COIN/10000)*123456789);

    BOOST_CHECK_EQUAL(ParseMoney("10000000.00").value(), COIN*10000000);
    BOOST_CHECK_EQUAL(ParseMoney("1000000.00").value(), COIN*1000000);
    BOOST_CHECK_EQUAL(ParseMoney("100000.00").value(), COIN*100000);
    BOOST_CHECK_EQUAL(ParseMoney("10000.00").value(), COIN*10000);
    BOOST_CHECK_EQUAL(ParseMoney("1000.00").value(), COIN*1000);
    BOOST_CHECK_EQUAL(ParseMoney("100.00").value(), COIN*100);
    BOOST_CHECK_EQUAL(ParseMoney("10.00").value(), COIN*10);
    BOOST_CHECK_EQUAL(ParseMoney("1.00").value(), COIN);
    BOOST_CHECK_EQUAL(ParseMoney("1").value(), COIN);
    BOOST_CHECK_EQUAL(ParseMoney("   1").value(), COIN);
    BOOST_CHECK_EQUAL(ParseMoney("1   ").value(), COIN);
    BOOST_CHECK_EQUAL(ParseMoney("  1 ").value(), COIN);
    BOOST_CHECK_EQUAL(ParseMoney("0.1").value(), COIN/10);
    BOOST_CHECK_EQUAL(ParseMoney("0.01").value(), COIN/100);
    BOOST_CHECK_EQUAL(ParseMoney("0.001").value(), COIN/1000);
    BOOST_CHECK_EQUAL(ParseMoney("0.0001").value(), COIN/10000);
    BOOST_CHECK_EQUAL(ParseMoney("0.00001").value(), COIN/100000);
    BOOST_CHECK_EQUAL(ParseMoney("0.000001").value(), COIN/1000000);
    BOOST_CHECK_EQUAL(ParseMoney("0.0000001").value(), COIN/10000000);
    BOOST_CHECK_EQUAL(ParseMoney("0.00000001").value(), COIN/100000000);
    BOOST_CHECK_EQUAL(ParseMoney(" 0.00000001 ").value(), COIN/100000000);
    BOOST_CHECK_EQUAL(ParseMoney("0.00000001 ").value(), COIN/100000000);
    BOOST_CHECK_EQUAL(ParseMoney(" 0.00000001").value(), COIN/100000000);

    // Parsing amount that cannot be represented should fail
    BOOST_CHECK(!ParseMoney("100000000.00"));
    BOOST_CHECK(!ParseMoney("0.000000001"));

    // Parsing empty string should fail
    BOOST_CHECK(!ParseMoney(""));
    BOOST_CHECK(!ParseMoney(" "));
    BOOST_CHECK(!ParseMoney("  "));

    // Parsing two numbers should fail
    BOOST_CHECK(!ParseMoney(".."));
    BOOST_CHECK(!ParseMoney("0..0"));
    BOOST_CHECK(!ParseMoney("1 2"));
    BOOST_CHECK(!ParseMoney(" 1 2 "));
    BOOST_CHECK(!ParseMoney(" 1.2 3 "));
    BOOST_CHECK(!ParseMoney(" 1 2.3 "));

    // Embedded whitespace should fail
    BOOST_CHECK(!ParseMoney(" -1 .2  "));
    BOOST_CHECK(!ParseMoney("  1 .2  "));
    BOOST_CHECK(!ParseMoney(" +1 .2  "));

    // Attempted 63 bit overflow should fail
    BOOST_CHECK(!ParseMoney("92233720368.54775808"));

    // Parsing negative amounts must fail
    BOOST_CHECK(!ParseMoney("-1"));

    // Parsing strings with embedded NUL characters should fail
    BOOST_CHECK(!ParseMoney("\0-1"s));
    BOOST_CHECK(!ParseMoney(STRING_WITH_EMBEDDED_NULL_CHAR));
    BOOST_CHECK(!ParseMoney("1\0"s));
}